

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt6LastBit(word t)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = t >> 0x20 == 0;
  uVar1 = t << 0x20;
  if (!bVar5) {
    uVar1 = t;
  }
  iVar2 = (uint)bVar5 * 0x20;
  iVar3 = iVar2 + 0x10;
  uVar4 = uVar1 << 0x10;
  if (uVar1 >> 0x30 != 0) {
    iVar3 = iVar2;
    uVar4 = uVar1;
  }
  iVar2 = iVar3 + 8;
  uVar1 = uVar4 << 8;
  if (uVar4 >> 0x38 != 0) {
    iVar2 = iVar3;
    uVar1 = uVar4;
  }
  bVar5 = uVar1 >> 0x3c != 0;
  uVar4 = uVar1 << 4;
  if (bVar5) {
    uVar4 = uVar1;
  }
  iVar3 = iVar2 + 4;
  if (bVar5) {
    iVar3 = iVar2;
  }
  iVar2 = iVar3 + 2;
  uVar1 = uVar4 * 4;
  if (uVar4 >> 0x3e != 0) {
    iVar2 = iVar3;
    uVar1 = uVar4;
  }
  return 0x3f - ((uint)(-1 < (long)uVar1) + iVar2);
}

Assistant:

static inline int Abc_Tt6LastBit( word t )
{
    int n = 0;
    if ( t == 0 ) return -1;
    if ( (t & ABC_CONST(0xFFFFFFFF00000000)) == 0 ) { n += 32; t <<= 32; }
    if ( (t & ABC_CONST(0xFFFF000000000000)) == 0 ) { n += 16; t <<= 16; }
    if ( (t & ABC_CONST(0xFF00000000000000)) == 0 ) { n +=  8; t <<=  8; }
    if ( (t & ABC_CONST(0xF000000000000000)) == 0 ) { n +=  4; t <<=  4; }
    if ( (t & ABC_CONST(0xC000000000000000)) == 0 ) { n +=  2; t <<=  2; }
    if ( (t & ABC_CONST(0x8000000000000000)) == 0 ) { n++; }
    return 63-n;
}